

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_1_if_stmt(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->val[-4] = (PVIPNode *)0x0;
  return;
}

Assistant:

YY_ACTION(void) yy_1_if_stmt(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define else_body G->val[-1]
#define elsif_body G->val[-2]
#define elsif_cond G->val[-3]
#define if_body G->val[-4]
#define if_cond G->val[-5]
  yyprintf((stderr, "do yy_1_if_stmt"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {if_body=NULL; }\n"));
  if_body=NULL; ;
#undef else_body
#undef elsif_body
#undef elsif_cond
#undef if_body
#undef if_cond
}